

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

void lyb_skip_siblings(lylyb_ctx *lybctx)

{
  lyd_lyb_sibling *plVar1;
  long lVar2;
  long lVar3;
  
  plVar1 = lybctx->siblings;
  do {
    lVar3 = -1;
    lVar2 = -1;
    if (plVar1 != (lyd_lyb_sibling *)0x0) {
      lVar2 = *(long *)&plVar1[-1].inner_chunks + -1;
    }
    ly_in_skip(lybctx->in,(ulong)plVar1[lVar2].inner_chunks << 2);
    plVar1 = lybctx->siblings;
    if (plVar1 != (lyd_lyb_sibling *)0x0) {
      lVar3 = *(long *)&plVar1[-1].inner_chunks + -1;
    }
    lyb_read((uint8_t *)0x0,plVar1[lVar3].written,lybctx);
    plVar1 = lybctx->siblings;
    if (plVar1 == (lyd_lyb_sibling *)0x0) {
      lVar2 = -1;
    }
    else {
      lVar2 = *(long *)&plVar1[-1].inner_chunks + -1;
    }
  } while (plVar1[lVar2].written != 0);
  return;
}

Assistant:

static void
lyb_skip_siblings(struct lylyb_ctx *lybctx)
{
    do {
        /* first skip any meta information inside */
        ly_in_skip(lybctx->in, LYB_LAST_SIBLING(lybctx).inner_chunks * LYB_META_BYTES);

        /* then read data */
        lyb_read(NULL, LYB_LAST_SIBLING(lybctx).written, lybctx);
    } while (LYB_LAST_SIBLING(lybctx).written);
}